

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

void dump_colors(ang_file *fff)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char *local_30;
  char *name;
  wchar_t bv;
  wchar_t gv;
  wchar_t rv;
  wchar_t kv;
  wchar_t i;
  ang_file *fff_local;
  
  for (rv = L'\0'; rv < L' '; rv = rv + L'\x01') {
    bVar1 = angband_color_table[rv][0];
    bVar2 = angband_color_table[rv][1];
    bVar3 = angband_color_table[rv][2];
    bVar4 = angband_color_table[rv][3];
    local_30 = "unknown";
    if ((((bVar1 != 0) || (bVar2 != 0)) || (bVar3 != 0)) || ((bVar4 != 0 || (rv < L'\x1d')))) {
      if (rv < L'\x1d') {
        local_30 = (char *)((long)rv * 0x2a + 0x371491);
      }
      file_putf(fff,"# Color: %s\n",local_30);
      file_putf(fff,"color:%d:%d:%d:%d:%d\n\n",(ulong)(uint)rv,(ulong)(uint)bVar1,(ulong)(uint)bVar2
                ,(ulong)(uint)bVar3,(uint)bVar4);
    }
  }
  return;
}

Assistant:

void dump_colors(ang_file *fff)
{
	int i;

	for (i = 0; i < MAX_COLORS; i++) {
		int kv = angband_color_table[i][0];
		int rv = angband_color_table[i][1];
		int gv = angband_color_table[i][2];
		int bv = angband_color_table[i][3];

		const char *name = "unknown";

		/* Skip non-entries, except those in the basic colors */
		if (!kv && !rv && !gv && !bv && i >= BASIC_COLORS) continue;

		/* Extract the color name */
		if (i < BASIC_COLORS) name = color_table[i].name;

		file_putf(fff, "# Color: %s\n", name);
		file_putf(fff, "color:%d:%d:%d:%d:%d\n\n", i, kv, rv, gv, bv);
	}
}